

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_4x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int32_t *piVar2;
  byte bVar3;
  code *pcVar4;
  code *pcVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  bool bVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  undefined7 in_register_00000009;
  long lVar24;
  bool bVar25;
  undefined8 *puVar26;
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  undefined8 local_248;
  byte *local_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined1 local_218 [12];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined1 local_1f8 [12];
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined1 local_1d8 [12];
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined1 local_1b8 [12];
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined1 local_198 [12];
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined1 local_178 [12];
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined1 local_158 [12];
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined8 local_138 [4];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar53 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  
  local_240 = (byte *)av1_fwd_txfm_shift_ls[0xd];
  uVar23 = (uint)CONCAT71(in_register_00000009,tx_type);
  local_248._4_4_ = 0;
  if (uVar23 < 0x10) {
    if ((0x4110U >> (uVar23 & 0x1f) & 1) != 0) {
LAB_004c1ac1:
      lVar24 = 0x100;
      do {
        *(undefined8 *)((long)&local_248 + lVar24) = *(undefined8 *)input;
        *(undefined8 *)(local_238 + lVar24 + -8) = 0;
        input = input + stride;
        lVar24 = lVar24 + -0x10;
      } while (lVar24 != 0);
      goto LAB_004c1ade;
    }
    if ((0x80a0U >> (uVar23 & 0x1f) & 1) == 0) {
      if (uVar23 == 6) {
        local_248._4_4_ = 1;
        goto LAB_004c1ac1;
      }
    }
    else {
      local_248._4_4_ = 1;
    }
  }
  lVar24 = 0;
  do {
    *(undefined8 *)(local_238 + lVar24) = *(undefined8 *)input;
    *(undefined8 *)((long)&uStack_230 + lVar24) = 0;
    lVar24 = lVar24 + 0x10;
    input = input + stride;
  } while (lVar24 != 0x100);
LAB_004c1ade:
  pcVar4 = *(code **)((long)col_txfm8x16_arr + (ulong)(uVar23 * 8));
  bVar3 = *local_240;
  uVar22 = (uint)(char)bVar3;
  if ((int)uVar22 < 0) {
    auVar35 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar35 = pshuflw(auVar35,auVar35,0);
    auVar35._4_4_ = auVar35._0_4_;
    auVar35._8_4_ = auVar35._0_4_;
    auVar35._12_4_ = auVar35._0_4_;
    lVar24 = 0;
    do {
      auVar48 = paddsw(*(undefined1 (*) [16])(local_238 + lVar24),auVar35);
      auVar48 = psraw(auVar48,ZEXT416(-uVar22));
      *(undefined1 (*) [16])(local_238 + lVar24) = auVar48;
      lVar24 = lVar24 + 0x10;
    } while (lVar24 != 0x100);
  }
  else if (bVar3 != 0) {
    lVar24 = 0;
    do {
      auVar35 = psllw(*(undefined1 (*) [16])(local_238 + lVar24),ZEXT416(uVar22));
      *(undefined1 (*) [16])(local_238 + lVar24) = auVar35;
      lVar24 = lVar24 + 0x10;
    } while (lVar24 != 0x100);
  }
  pcVar5 = *(code **)((long)row_txfm8x4_arr + (ulong)(uVar23 * 8));
  (*pcVar4)(local_238,local_238,0xd);
  bVar3 = local_240[1];
  uVar23 = (uint)(char)bVar3;
  if ((int)uVar23 < 0) {
    auVar35 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar35 = pshuflw(auVar35,auVar35,0);
    auVar48._0_4_ = auVar35._0_4_;
    auVar48._4_4_ = auVar48._0_4_;
    auVar48._8_4_ = auVar48._0_4_;
    auVar48._12_4_ = auVar48._0_4_;
    lVar24 = 0;
    do {
      auVar35 = paddsw(*(undefined1 (*) [16])(local_238 + lVar24),auVar48);
      auVar35 = psraw(auVar35,ZEXT416(-uVar23));
      *(undefined1 (*) [16])(local_238 + lVar24) = auVar35;
      lVar24 = lVar24 + 0x10;
    } while (lVar24 != 0x100);
  }
  else if (bVar3 != 0) {
    lVar24 = 0;
    do {
      auVar35 = psllw(*(undefined1 (*) [16])(local_238 + lVar24),ZEXT416(uVar23));
      *(undefined1 (*) [16])(local_238 + lVar24) = auVar35;
      lVar24 = lVar24 + 0x10;
    } while (lVar24 != 0x100);
  }
  auVar30._12_2_ = local_238._6_2_;
  auVar30._0_12_ = _local_238;
  auVar30._14_2_ = uStack_222;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = local_238._0_10_;
  auVar29._10_2_ = uStack_224;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = local_238;
  auVar28._8_2_ = local_238._4_2_;
  auVar11._4_8_ = auVar28._8_8_;
  auVar11._2_2_ = uStack_226;
  auVar11._0_2_ = local_238._2_2_;
  auVar27._0_4_ = CONCAT22(local_228,local_238._0_2_);
  auVar27._4_12_ = auVar11;
  auVar51._12_2_ = local_218._6_2_;
  auVar51._0_12_ = local_218;
  auVar51._14_2_ = uStack_202;
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._0_10_ = local_218._0_10_;
  auVar50._10_2_ = uStack_204;
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_8_ = local_218._0_8_;
  auVar49._8_2_ = local_218._4_2_;
  auVar12._4_8_ = auVar49._8_8_;
  auVar12._2_2_ = uStack_206;
  auVar12._0_2_ = local_218._2_2_;
  auVar39._12_2_ = local_1f8._6_2_;
  auVar39._0_12_ = local_1f8;
  auVar39._14_2_ = uStack_1e2;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = local_1f8._0_10_;
  auVar38._10_2_ = uStack_1e4;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = local_1f8._0_8_;
  auVar37._8_2_ = local_1f8._4_2_;
  auVar13._4_8_ = auVar37._8_8_;
  auVar13._2_2_ = uStack_1e6;
  auVar13._0_2_ = local_1f8._2_2_;
  auVar36._0_4_ = CONCAT22(local_1e8,local_1f8._0_2_);
  auVar36._4_12_ = auVar13;
  auVar58._12_2_ = local_1d8._6_2_;
  auVar58._0_12_ = local_1d8;
  auVar58._14_2_ = uStack_1c2;
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._0_10_ = local_1d8._0_10_;
  auVar57._10_2_ = uStack_1c4;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._0_8_ = local_1d8._0_8_;
  auVar56._8_2_ = local_1d8._4_2_;
  auVar14._4_8_ = auVar56._8_8_;
  auVar14._2_2_ = uStack_1c6;
  auVar14._0_2_ = local_1d8._2_2_;
  auVar62._0_8_ = auVar27._0_8_;
  auVar62._8_4_ = auVar11._0_4_;
  auVar62._12_4_ = auVar12._0_4_;
  auVar64._0_8_ = auVar36._0_8_;
  auVar64._8_4_ = auVar13._0_4_;
  auVar64._12_4_ = auVar14._0_4_;
  local_138[0] = CONCAT44(CONCAT22(local_208,local_218._0_2_),auVar27._0_4_);
  local_138[1] = CONCAT44(CONCAT22(local_1c8,local_1d8._0_2_),auVar36._0_4_);
  local_138[2] = auVar62._8_8_;
  local_138[3] = auVar64._8_8_;
  auVar55._12_2_ = local_1b8._6_2_;
  auVar55._0_12_ = local_1b8;
  auVar55._14_2_ = uStack_1a2;
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._0_10_ = local_1b8._0_10_;
  auVar54._10_2_ = uStack_1a4;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._0_8_ = local_1b8._0_8_;
  auVar53._8_2_ = local_1b8._4_2_;
  auVar15._4_8_ = auVar53._8_8_;
  auVar15._2_2_ = uStack_1a6;
  auVar15._0_2_ = local_1b8._2_2_;
  auVar52._0_4_ = CONCAT22(local_1a8,local_1b8._0_2_);
  auVar52._4_12_ = auVar15;
  local_118 = auVar28._8_4_;
  uStack_114 = auVar49._8_4_;
  uStack_110 = auVar37._8_4_;
  uStack_10c = auVar56._8_4_;
  auVar61._12_2_ = local_198._6_2_;
  auVar61._0_12_ = local_198;
  auVar61._14_2_ = uStack_182;
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._0_10_ = local_198._0_10_;
  auVar60._10_2_ = uStack_184;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._0_8_ = local_198._0_8_;
  auVar59._8_2_ = local_198._4_2_;
  auVar16._4_8_ = auVar59._8_8_;
  auVar16._2_2_ = uStack_186;
  auVar16._0_2_ = local_198._2_2_;
  auVar43._12_2_ = local_178._6_2_;
  auVar43._0_12_ = local_178;
  auVar43._14_2_ = uStack_162;
  auVar42._12_4_ = auVar43._12_4_;
  auVar42._0_10_ = local_178._0_10_;
  auVar42._10_2_ = uStack_164;
  auVar41._10_6_ = auVar42._10_6_;
  auVar41._0_8_ = local_178._0_8_;
  auVar41._8_2_ = local_178._4_2_;
  auVar17._4_8_ = auVar41._8_8_;
  auVar17._2_2_ = uStack_166;
  auVar17._0_2_ = local_178._2_2_;
  auVar40._0_4_ = CONCAT22(local_168,local_178._0_2_);
  auVar40._4_12_ = auVar17;
  uStack_100 = auVar29._12_4_;
  uStack_fc = auVar50._12_4_;
  uStack_f8 = auVar38._12_4_;
  uStack_f4 = auVar57._12_4_;
  auVar33._12_2_ = local_158._6_2_;
  auVar33._0_12_ = local_158;
  auVar33._14_2_ = uStack_142;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = local_158._0_10_;
  auVar32._10_2_ = uStack_144;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = local_158._0_8_;
  auVar31._8_2_ = local_158._4_2_;
  auVar18._4_8_ = auVar31._8_8_;
  auVar18._2_2_ = uStack_146;
  auVar18._0_2_ = local_158._2_2_;
  auVar63._0_8_ = auVar52._0_8_;
  auVar63._8_4_ = auVar15._0_4_;
  auVar63._12_4_ = auVar16._0_4_;
  auVar65._0_8_ = auVar40._0_8_;
  auVar65._8_4_ = auVar17._0_4_;
  auVar65._12_4_ = auVar18._0_4_;
  local_b8 = CONCAT44(CONCAT22(local_188,local_198._0_2_),auVar52._0_4_);
  uStack_b0 = CONCAT44(CONCAT22(local_148,local_158._0_2_),auVar40._0_4_);
  local_a8 = auVar63._8_8_;
  uStack_a0 = auVar65._8_8_;
  local_98 = auVar53._8_4_;
  uStack_94 = auVar59._8_4_;
  uStack_90 = auVar41._8_4_;
  uStack_8c = auVar31._8_4_;
  uStack_80 = auVar54._12_4_;
  uStack_7c = auVar60._12_4_;
  uStack_78 = auVar42._12_4_;
  uStack_74 = auVar32._12_4_;
  lVar24 = 0;
  bVar20 = true;
  do {
    bVar25 = bVar20;
    puVar26 = local_138 + lVar24 * 0x10;
    if (local_248._4_4_ != 0) {
      lVar21 = 0x40;
      do {
        uVar10 = puVar26[1];
        *(undefined8 *)((long)&local_248 + lVar21) = *puVar26;
        *(undefined8 *)(local_238 + lVar21 + -8) = uVar10;
        puVar26 = puVar26 + 2;
        lVar21 = lVar21 + -0x10;
      } while (lVar21 != 0);
      puVar26 = (undefined8 *)local_238;
    }
    (*pcVar5)(puVar26,puVar26,0xc);
    auVar44._8_8_ = extraout_XMM1_Qb;
    auVar44._0_8_ = extraout_XMM1_Qa;
    bVar3 = local_240[2];
    uVar23 = (uint)(char)bVar3;
    if ((int)uVar23 < 0) {
      auVar35 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar35 = pshuflw(auVar35,auVar35,0);
      auVar34._0_4_ = auVar35._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      lVar21 = 0;
      do {
        auVar35 = paddsw(*(undefined1 (*) [16])((long)puVar26 + lVar21),auVar34);
        auVar44 = psraw(auVar35,ZEXT416(-uVar23));
        *(undefined1 (*) [16])((long)puVar26 + lVar21) = auVar44;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x40);
    }
    else if (bVar3 != 0) {
      lVar21 = 0;
      do {
        auVar44 = ZEXT416(uVar23);
        auVar35 = psllw(*(undefined1 (*) [16])((long)puVar26 + lVar21),auVar44);
        *(undefined1 (*) [16])((long)puVar26 + lVar21) = auVar35;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x40);
    }
    lVar21 = 0;
    do {
      psVar1 = (short *)((long)puVar26 + lVar21);
      sVar6 = psVar1[4];
      sVar7 = psVar1[5];
      sVar8 = psVar1[6];
      sVar9 = psVar1[7];
      auVar47._0_12_ = auVar44._0_12_;
      auVar47._12_2_ = auVar44._6_2_;
      auVar47._14_2_ = psVar1[3];
      auVar46._12_4_ = auVar47._12_4_;
      auVar46._0_10_ = auVar44._0_10_;
      auVar46._10_2_ = psVar1[2];
      auVar45._10_6_ = auVar46._10_6_;
      auVar45._0_8_ = auVar44._0_8_;
      auVar45._8_2_ = auVar44._4_2_;
      auVar19._4_8_ = auVar45._8_8_;
      auVar19._2_2_ = psVar1[1];
      auVar19._0_2_ = auVar44._2_2_;
      auVar44._0_4_ = (int)*psVar1;
      auVar44._4_4_ = auVar19._0_4_ >> 0x10;
      auVar44._8_4_ = auVar45._8_4_ >> 0x10;
      auVar44._12_4_ = auVar46._12_4_ >> 0x10;
      *(undefined1 (*) [16])(output + lVar24 * 8 + lVar21) = auVar44;
      piVar2 = output + lVar24 * 8 + lVar21 + 4;
      *piVar2 = (int)sVar6;
      piVar2[1] = (int)sVar7;
      piVar2[2] = (int)sVar8;
      piVar2[3] = (int)sVar9;
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x40);
    lVar24 = 1;
    bVar20 = false;
  } while (bVar25);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x16_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X16];
  const int txw_idx = get_txw_idx(TX_4X16);
  const int txh_idx = get_txh_idx(TX_4X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x8(buf0, buf1);
  transpose_16bit_4x8(buf0 + 8, buf1 + 8);

  for (int i = 0; i < 2; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + 8 * i, buf, width);
    } else {
      buf = buf1 + 8 * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}